

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::GeneratedCodeInfo::Clear(GeneratedCodeInfo *this)

{
  InternalMetadataWithArena *in_RDI;
  uint32 cached_has_bits;
  
  RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation>::Clear
            ((RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation> *)0x537b64);
  memset(in_RDI + 2,0,4);
  if (((uint)in_RDI[1].
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    internal::InternalMetadataWithArena::DoClear(in_RDI);
  }
  return;
}

Assistant:

void GeneratedCodeInfo::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.GeneratedCodeInfo)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  annotation_.Clear();
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}